

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O1

void __thiscall RK_Individual::calculaFuncaoObjetivoOtimizado(RK_Individual *this,Graph *g)

{
  double dVar1;
  int iVar2;
  Chromosome *pCVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  pointer ppCVar6;
  ulong uVar7;
  pointer ppCVar8;
  pointer ppCVar9;
  Edge *pEVar10;
  double *pdVar11;
  pointer ppCVar12;
  pointer ppCVar13;
  pointer ppCVar14;
  long lVar15;
  pointer ppCVar16;
  value_type __val_2;
  int iVar17;
  size_t sVar18;
  Vertex *pVVar19;
  value_type __val;
  int iVar20;
  value_type __val_6;
  long lVar21;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_> __i;
  pointer ppCVar22;
  
  ppCVar6 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar22 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar21 = (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar7 = lVar21 >> 3;
    lVar15 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
              ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                 .super__Vector_impl_data._M_finish,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x1055a2);
    ppCVar9 = ppCVar22 + 1;
    ppCVar16 = ppCVar22;
    if (lVar21 < 0x81) {
      while (ppCVar12 = ppCVar9, ppCVar12 != ppCVar6) {
        pCVar3 = *ppCVar12;
        iVar17 = pCVar3->position;
        if (iVar17 < (*ppCVar22)->position) {
          memmove((void *)((long)ppCVar16 + (0x10 - ((long)ppCVar12 - (long)ppCVar22))),ppCVar22,
                  (long)ppCVar12 - (long)ppCVar22);
          ppCVar9 = ppCVar22;
        }
        else {
          iVar20 = (*ppCVar16)->position;
          ppCVar9 = ppCVar12;
          while (iVar17 < iVar20) {
            *ppCVar9 = ppCVar9[-1];
            iVar20 = ppCVar9[-2]->position;
            ppCVar9 = ppCVar9 + -1;
          }
        }
        *ppCVar9 = pCVar3;
        ppCVar16 = ppCVar12;
        ppCVar9 = ppCVar12 + 1;
      }
    }
    else {
      sVar18 = 8;
      ppCVar16 = ppCVar9;
      ppCVar12 = ppCVar22;
      do {
        ppCVar14 = (pointer)((long)ppCVar22 + sVar18);
        pCVar3 = *(Chromosome **)((long)ppCVar22 + sVar18);
        iVar17 = pCVar3->position;
        if (iVar17 < (*ppCVar22)->position) {
          memmove(ppCVar9,ppCVar22,sVar18);
          ppCVar12 = ppCVar22;
        }
        else {
          iVar20 = (*ppCVar12)->position;
          ppCVar12 = ppCVar14;
          ppCVar8 = ppCVar16;
          while (iVar17 < iVar20) {
            ppCVar12 = ppCVar8 + -1;
            *ppCVar8 = ppCVar8[-1];
            iVar20 = ppCVar8[-2]->position;
            ppCVar8 = ppCVar12;
          }
        }
        *ppCVar12 = pCVar3;
        sVar18 = sVar18 + 8;
        ppCVar16 = ppCVar16 + 1;
        ppCVar12 = ppCVar14;
      } while (sVar18 != 0x80);
      for (ppCVar22 = ppCVar22 + 0x10; ppCVar22 != ppCVar6; ppCVar22 = ppCVar22 + 1) {
        pCVar3 = *ppCVar22;
        iVar20 = pCVar3->position;
        iVar17 = ppCVar22[-1]->position;
        ppCVar9 = ppCVar22;
        while (iVar20 < iVar17) {
          *ppCVar9 = ppCVar9[-1];
          iVar17 = ppCVar9[-2]->position;
          ppCVar9 = ppCVar9 + -1;
        }
        *ppCVar9 = pCVar3;
      }
    }
  }
  ppCVar22 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar17 = this->number_of_edges;
  if (0 < (long)iVar17) {
    lVar15 = (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    pdVar11 = this->weights;
    uVar7 = 0;
    do {
      if (lVar15 >> 3 == uVar7) goto LAB_00105f8f;
      ppCVar22[uVar7]->weight = pdVar11[uVar7];
      uVar7 = uVar7 + 1;
    } while ((long)iVar17 != uVar7);
  }
  ppCVar6 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar22 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar21 = (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar7 = lVar21 >> 3;
    lVar15 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
              ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                 .super__Vector_impl_data._M_finish,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x105594);
    ppCVar9 = ppCVar22 + 1;
    ppCVar16 = ppCVar22;
    if (lVar21 < 0x81) {
      while (ppCVar12 = ppCVar9, ppCVar12 != ppCVar6) {
        pCVar3 = *ppCVar12;
        dVar1 = pCVar3->weight;
        if (dVar1 < (*ppCVar22)->weight || dVar1 == (*ppCVar22)->weight) {
          ppCVar9 = ppCVar12;
          ppCVar14 = ppCVar12;
          if ((*ppCVar16)->weight <= dVar1 && dVar1 != (*ppCVar16)->weight) {
            do {
              ppCVar9 = ppCVar14 + -1;
              ppCVar16 = ppCVar14 + -2;
              *ppCVar14 = ppCVar14[-1];
              ppCVar14 = ppCVar9;
            } while ((*ppCVar16)->weight <= dVar1 && dVar1 != (*ppCVar16)->weight);
          }
        }
        else {
          memmove((void *)((long)ppCVar16 + (0x10 - ((long)ppCVar12 - (long)ppCVar22))),ppCVar22,
                  (long)ppCVar12 - (long)ppCVar22);
          ppCVar9 = ppCVar22;
        }
        *ppCVar9 = pCVar3;
        ppCVar16 = ppCVar12;
        ppCVar9 = ppCVar12 + 1;
      }
    }
    else {
      sVar18 = 8;
      ppCVar16 = ppCVar9;
      ppCVar12 = ppCVar22;
      do {
        ppCVar14 = (pointer)((long)ppCVar22 + sVar18);
        pCVar3 = *(Chromosome **)((long)ppCVar22 + sVar18);
        dVar1 = pCVar3->weight;
        if (dVar1 < (*ppCVar22)->weight || dVar1 == (*ppCVar22)->weight) {
          ppCVar8 = ppCVar14;
          ppCVar13 = ppCVar16;
          if ((*ppCVar12)->weight <= dVar1 && dVar1 != (*ppCVar12)->weight) {
            do {
              ppCVar8 = ppCVar13 + -1;
              ppCVar12 = ppCVar13 + -2;
              *ppCVar13 = ppCVar13[-1];
              ppCVar13 = ppCVar8;
            } while ((*ppCVar12)->weight <= dVar1 && dVar1 != (*ppCVar12)->weight);
          }
        }
        else {
          memmove(ppCVar9,ppCVar22,sVar18);
          ppCVar8 = ppCVar22;
        }
        *ppCVar8 = pCVar3;
        sVar18 = sVar18 + 8;
        ppCVar16 = ppCVar16 + 1;
        ppCVar12 = ppCVar14;
      } while (sVar18 != 0x80);
      for (ppCVar22 = ppCVar22 + 0x10; ppCVar22 != ppCVar6; ppCVar22 = ppCVar22 + 1) {
        pCVar3 = *ppCVar22;
        dVar1 = pCVar3->weight;
        ppCVar9 = ppCVar22;
        ppCVar16 = ppCVar22;
        if (ppCVar22[-1]->weight <= dVar1 && dVar1 != ppCVar22[-1]->weight) {
          do {
            ppCVar9 = ppCVar16 + -1;
            ppCVar12 = ppCVar16 + -2;
            *ppCVar16 = ppCVar16[-1];
            ppCVar16 = ppCVar9;
          } while ((*ppCVar12)->weight <= dVar1 && dVar1 != (*ppCVar12)->weight);
        }
        *ppCVar9 = pCVar3;
      }
    }
  }
  iVar17 = ~g->numberOfNonModifiable + g->verticesSize;
  if (0 < iVar17) {
    uVar7 = 0;
    iVar20 = 0;
    do {
      if ((ulong)((long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar7) {
LAB_00105f8f:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      pEVar10 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7]->edge;
      pVVar4 = pEVar10->origin;
      pVVar5 = pEVar10->destiny;
      iVar2 = pVVar4->idTree;
      if ((iVar2 != pVVar5->idTree) && (pEVar10->closed == false)) {
        for (pVVar19 = g->verticesList; pVVar19 != (Vertex *)0x0; pVVar19 = pVVar19->nextVertex) {
          if (pVVar19->idTree == iVar2) {
            pVVar19->idTree = pVVar5->idTree;
          }
        }
        pEVar10->closed = true;
        pEVar10 = Graph::findEdge(g,pVVar5->id,pVVar4->id);
        pEVar10->closed = true;
        iVar20 = iVar20 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (iVar20 < iVar17);
  }
  Graph::defineFlows(g);
  Graph::evaluateLossesAndFlows(g,1e-08,0);
  pdVar11 = Graph::getLossesReseting(g);
  this->active_loss = *pdVar11;
  this->reactive_loss = pdVar11[1];
  if (NAN(*pdVar11)) {
    this->active_loss = 9999999999.0;
  }
  if (NAN(pdVar11[1])) {
    this->reactive_loss = 9999999999.0;
  }
  operator_delete(pdVar11,8);
  return;
}

Assistant:

void RK_Individual::calculaFuncaoObjetivoOtimizado(Graph *g){

    /** colocar os cromossomos na ordem correta em que aparecem no grafo antes de associar os pesos **/
    sort(cromossomos.begin(), cromossomos.end(), ordenaPosicaoCromossomo);

    /** copia peso do individio paca cada cromossomo **/
    for(int i=0; i<this->getNumEdges(); i++)
        cromossomos.at(i)->weight = this->weights[i];

    sort(cromossomos.begin(), cromossomos.end(), sortChromosome);

    int n_arc_inseridos = 0, n_arcos_inserir = g->getVerticesSize() - 1 - g->getNumberOfNonModifiable();


    /** percorre vetor de cromossomos ordenados e tenta fechar chave(algoritmo de kruskal) **/
    for(int i=0; n_arc_inseridos<n_arcos_inserir; i++){

        if((cromossomos.at(i)->edge->getOrigin()->getIdTree() != cromossomos.at(i)->edge->getDestiny()->getIdTree()) &&
                cromossomos.at(i)->edge->isClosed() == false){

            int id = cromossomos.at(i)->edge->getOrigin()->getIdTree();
            for(Vertex *no = g->get_verticesList(); no != NULL; no = no->getNext()){
                if(no->getIdTree() == id)
                    no->setIdTree(cromossomos.at(i)->edge->getDestiny()->getIdTree());
            }

            cromossomos.at(i)->edge->setSwitch(true);
            g->findEdge(cromossomos.at(i)->edge->getDestiny()->getID(),
                        cromossomos.at(i)->edge->getOrigin()->getID())->setSwitch(true);

            n_arc_inseridos++;
        }

    }


    g->defineFlows();
    g->evaluateLossesAndFlows(1e-8); /** calcula fluxos e perda com erro de 1e-5 **/

    double *perdas = g->getLossesReseting();/** soma as perdas ativas e reativas em todos os arcos e retorna um double* **/

    this->active_loss = perdas[0];
    this->reactive_loss = perdas[1];

    /** no caso de solucoes que possuem configuracao viavel porem sao muito longas **/
    if(isnan(perdas[0]))
        this->active_loss = 9999999999;

    if(isnan(perdas[1]))
        this->reactive_loss = 9999999999;

    delete perdas;
}